

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O3

void __thiscall libtorrent::upnp::start(upnp *this)

{
  int iVar1;
  double __x;
  double __x_00;
  error_code ec;
  error_code local_40;
  long *local_30 [2];
  long local_20 [2];
  
  local_40.val_ = 0;
  local_40.failed_ = false;
  local_40.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  open_multicast_socket(this,&this->m_multicast,&local_40);
  if (local_40.failed_ == true) {
    iVar1 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar1 == '\0') goto LAB_003801d2;
    (*((error_category *)&(local_40.cat_)->_vptr_error_category)->_vptr_error_category[4])
              (local_30,local_40.cat_,(ulong)(uint)local_40.val_);
    log(this,__x);
LAB_0038022e:
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    this->m_disabled = true;
  }
  else {
LAB_003801d2:
    open_unicast_socket(this,&this->m_unicast,&local_40);
    if (local_40.failed_ == true) {
      iVar1 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar1 != '\0') {
        (*((error_category *)&(local_40.cat_)->_vptr_error_category)->_vptr_error_category[4])
                  (local_30,local_40.cat_,(ulong)(uint)local_40.val_);
        log(this,__x_00);
        goto LAB_0038022e;
      }
    }
    ::std::
    vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
    ::reserve(&(this->m_mappings).
               super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
              ,2);
    discover_device_impl(this);
  }
  return;
}

Assistant:

void upnp::start()
{
	TORRENT_ASSERT(is_single_thread());

	error_code ec;
	open_multicast_socket(m_multicast, ec);
#ifndef TORRENT_DISABLE_LOGGING
	if (ec && should_log())
	{
		log("failed to open multicast socket: \"%s\""
			, ec.message().c_str());
		m_disabled = true;
		return;
	}
#endif

	open_unicast_socket(m_unicast, ec);
#ifndef TORRENT_DISABLE_LOGGING
	if (ec && should_log())
	{
		log("failed to open unicast socket: \"%s\""
			, ec.message().c_str());
		m_disabled = true;
		return;
	}
#endif

	m_mappings.reserve(2);

	discover_device_impl();
}